

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::TlsTest::readFromClient(TlsTest *this,AsyncIoStream *server)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  PromiseArena *__buf;
  void *pvVar3;
  PromiseBase extraout_RAX;
  undefined **ppuVar4;
  TransformPromiseNodeBase *this_00;
  Promise<void> readPromise;
  Array<unsigned_char> buf;
  AsyncInputStream local_50;
  PromiseArena *local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  __buf = (PromiseArena *)
          kj::_::HeapArrayDisposer::allocateImpl
                    (1,4,4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  uStack_40 = 4;
  local_38 = &kj::_::HeapArrayDisposer::instance;
  local_48 = __buf;
  AsyncInputStream::read(&local_50,(int)server,__buf,4);
  AVar2._vptr_AsyncInputStream = local_50._vptr_AsyncInputStream;
  local_48 = (PromiseArena *)0x0;
  uStack_40 = 0;
  pPVar1 = (PromiseArena *)local_50._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_50._vptr_AsyncInputStream - (long)pPVar1) < 0x38) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3c8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_50,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:443:24)>
               ::anon_class_24_1_ba1d39d3_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3c8) = &PTR_destroy_00618890;
    *(PromiseArena **)((long)pvVar3 + 1000) = __buf;
    *(undefined8 *)((long)pvVar3 + 0x3f0) = 4;
    *(undefined8 **)((long)pvVar3 + 0x3f8) = &kj::_::HeapArrayDisposer::instance;
    *(void **)((long)pvVar3 + 0x3d0) = pvVar3;
  }
  else {
    local_50._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_50._vptr_AsyncInputStream + -7);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_50,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls-test.c++:443:24)>
               ::anon_class_24_1_ba1d39d3_for_func::operator());
    AVar2._vptr_AsyncInputStream[-7] = (_func_int *)&PTR_destroy_00618890;
    AVar2._vptr_AsyncInputStream[-3] = (_func_int *)__buf;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -2))->_vptr_PromiseArenaMember =
         (_func_int **)0x4;
    AVar2._vptr_AsyncInputStream[-1] = (_func_int *)&kj::_::HeapArrayDisposer::instance;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -6))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  AVar2._vptr_AsyncInputStream = local_50._vptr_AsyncInputStream;
  ppuVar4 = &PTR_destroy_00618890;
  (this->io).lowLevelProvider.disposer = (Disposer *)this_00;
  if ((PromiseArenaMember *)local_50._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
    local_50._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
    ppuVar4 = (undefined **)extraout_RAX.node.ptr;
  }
  return (Promise<void>)ppuVar4;
}

Assistant:

Promise<void> readFromClient(AsyncIoStream& server) {
    auto buf = heapArray<byte>(4);

    auto readPromise = server.read(buf);

    auto checkBuffer = [buf = kj::mv(buf)]() {
      KJ_ASSERT(buf == "foo\x00"_kjb);
    };

    return readPromise.then(kj::mv(checkBuffer));
  }